

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_lib.cc
# Opt level: O2

int ASN1_put_eoc(uchar **pp)

{
  uchar *puVar1;
  
  puVar1 = *pp;
  puVar1[0] = '\0';
  puVar1[1] = '\0';
  *pp = puVar1 + 2;
  return 2;
}

Assistant:

int ASN1_put_eoc(unsigned char **pp) {
  // This function is no longer used in the library, but some external code
  // uses it.
  unsigned char *p = *pp;
  *p++ = 0;
  *p++ = 0;
  *pp = p;
  return 2;
}